

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int dupedExprSize(Expr *p,int flags)

{
  int flags_00;
  int iVar1;
  uint in_ESI;
  long in_RDI;
  int nByte;
  int in_stack_ffffffffffffffec;
  int iVar2;
  
  iVar2 = 0;
  if ((in_RDI != 0) &&
     (iVar2 = dupedExprNodeSize((Expr *)((ulong)in_ESI << 0x20),in_stack_ffffffffffffffec),
     (in_ESI & 1) != 0)) {
    flags_00 = dupedExprSize((Expr *)CONCAT44(in_ESI,iVar2),in_stack_ffffffffffffffec);
    iVar1 = dupedExprSize((Expr *)CONCAT44(in_ESI,iVar2),flags_00);
    iVar2 = flags_00 + iVar1 + iVar2;
  }
  return iVar2;
}

Assistant:

static int dupedExprSize(Expr *p, int flags){
  int nByte = 0;
  if( p ){
    nByte = dupedExprNodeSize(p, flags);
    if( flags&EXPRDUP_REDUCE ){
      nByte += dupedExprSize(p->pLeft, flags) + dupedExprSize(p->pRight, flags);
    }
  }
  return nByte;
}